

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

Var BailOutRecord::BailOutHelper
              (JavascriptCallStackLayout *layout,ScriptFunction **functionRef,Arguments *args,
              bool isInlinee,BailOutRecord *bailOutRecord,uint32 bailOutOffset,void *returnAddress,
              BailOutKind bailOutKind,Var *registerSaves,BailOutReturnValue *bailOutReturnValue,
              Var *pArgumentsObject,Var branchValue,void *argoutRestoreAddress)

{
  undefined1 *puVar1;
  byte *pbVar2;
  byte bVar3;
  ImplicitCallFlags flags;
  Type TVar4;
  LocalFunctionId LVar5;
  Utf8SourceInfo *pUVar6;
  ScriptFunction *pSVar7;
  JavascriptFunction *pJVar8;
  code *pcVar9;
  ushort uVar10;
  JavascriptCallStackLayout *pJVar11;
  ScriptContext *pSVar12;
  Arguments *pAVar13;
  BailOutRecord *pBVar14;
  bool bVar15;
  uint uVar16;
  int iVar17;
  RegSlot RVar18;
  uint32 uVar19;
  RegSlot localRegisterID;
  RegSlot localRegisterID_00;
  FunctionBody *pFVar20;
  DebuggingFlags *this;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 *puVar21;
  undefined4 extraout_var_03;
  char16 *pcVar22;
  char16 *pcVar23;
  char *pcVar24;
  undefined4 extraout_var_04;
  Var pvVar25;
  Var pvVar26;
  Var *allocation;
  void *pvVar27;
  LoopHeader *loopHeaderArray;
  Var *ppvVar28;
  JavascriptGenerator *this_00;
  ForInObjectEnumerator *pFVar29;
  FunctionBody *pFVar30;
  Var *ppvVar31;
  FrameDisplay *pFVar32;
  ScriptFunction *pSVar33;
  DynamicProfileInfo *this_01;
  ThreadContext *instance;
  ThreadContext *pTVar34;
  ushort uVar35;
  undefined7 in_register_00000009;
  undefined8 unaff_RBX;
  Var *ppvVar36;
  ulong uVar37;
  Var *stackAllocation;
  uint32 index;
  ulong uVar38;
  Var local_138;
  char16 debugStringBuffer [42];
  ArenaAllocator *tmpAlloc;
  JavascriptGenerator *generator;
  bool local_c8;
  uint local_b0;
  uint local_ac;
  ScriptFunction **local_98;
  FunctionBody *local_90;
  NumberSet *local_88;
  undefined4 local_7c;
  JavascriptCallStackLayout *local_78;
  ScriptContext *local_70;
  ScriptFunction *local_68;
  Arguments *local_60;
  char16 *local_58;
  undefined4 local_50;
  undefined4 local_4c;
  BailOutRecord *local_48;
  ThreadContext *local_40;
  uint32 local_34;
  
  ppvVar36 = &local_138;
  local_50 = (undefined4)CONCAT71(in_register_00000009,isInlinee);
  local_68 = *functionRef;
  local_98 = functionRef;
  local_78 = layout;
  local_48 = bailOutRecord;
  pFVar20 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_68);
  local_70 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar20);
  pTVar34 = local_70->threadContext;
  pTVar34->disableImplicitFlags = DisableImplicitNoFlag;
  pUVar6 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  if (((pUVar6->debugModeSource).ptr == (uchar *)0x0) && ((pUVar6->field_0xa8 & 0x20) == 0)) {
    local_7c = 0;
  }
  else {
    uVar37 = CONCAT71((int7)((ulong)unaff_RBX >> 8),pUVar6->field_0xa8) & 0xffffffffffffff40;
    local_7c = (undefined4)CONCAT71((int7)(uVar37 >> 8),(byte)uVar37 >> 6);
  }
  local_4c = (undefined4)CONCAT71((int7)((ulong)local_70 >> 8),1);
  local_60 = args;
  uVar19 = bailOutOffset;
  if ((char)local_7c != '\0') {
    local_40 = (ThreadContext *)pTVar34->debugManager;
    this = Js::DebugManager::GetDebuggingFlags((DebugManager *)local_40);
    local_34 = DebuggingFlags::GetByteCodeOffsetAfterIgnoreException(this);
    if (((bailOutKind >> 0x1b & 1) != 0) ||
       (args = local_60, uVar19 = bailOutOffset, local_34 != 0xffffffff)) {
      uVar16 = DebuggingFlags::GetFuncNumberAfterIgnoreException(this);
      pFVar30 = (FunctionBody *)(ulong)uVar16;
      if (uVar16 == 0) {
        bVar15 = true;
      }
      else {
        uVar16 = DebuggingFlags::GetFuncNumberAfterIgnoreException(this);
        pFVar30 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_68);
        bVar15 = uVar16 == (pFVar30->super_ParseableFunctionInfo).super_FunctionProxy.
                           m_functionNumber;
      }
      if (bVar15) {
        if (local_34 == 0xffffffff) {
          uVar16 = DebuggingFlags::GetFuncNumberAfterIgnoreException(this);
          pFVar30 = (FunctionBody *)(ulong)uVar16;
          if (uVar16 != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar21 = 1;
            bVar15 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                ,0x5af,
                                "(!(byteCodeOffsetAfterEx == DebuggingFlags::InvalidByteCodeOffset && debuggingFlags->GetFuncNumberAfterIgnoreException() != DebuggingFlags::InvalidFuncNumber))"
                                ,
                                "!(byteCodeOffsetAfterEx == DebuggingFlags::InvalidByteCodeOffset && debuggingFlags->GetFuncNumberAfterIgnoreException() != DebuggingFlags::InvalidFuncNumber)"
                               );
            pFVar30 = (FunctionBody *)CONCAT71(extraout_var_00,bVar15);
            if (!bVar15) goto LAB_00401970;
            *puVar21 = 0;
          }
        }
        pTVar34 = local_40;
        if (local_34 == 0xffffffff) {
          local_4c = (undefined4)CONCAT71((int7)((ulong)pFVar30 >> 8),1);
          bVar15 = false;
          local_34 = bailOutOffset;
        }
        else {
          bVar15 = Js::StepController::IsActive
                             ((StepController *)
                              ((local_40->preReservedVirtualAllocator).freeSegments.data + 0x13));
          if (bVar15) {
            (pTVar34->preReservedVirtualAllocator).freeSegments.data[0x17].word = 0;
          }
          bVar15 = true;
          if (((bailOutKind >> 0x1b & 1) == 0) || (local_34 != bailOutOffset)) {
            uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
            if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
                (FunctionInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              local_40 = (ThreadContext *)__tls_get_addr(&PTR_0155fe48);
              *(undefined4 *)
               &(local_40->super_DefaultRecyclerCollectionWrapper).super_RecyclerCollectionWrapper.
                _vptr_RecyclerCollectionWrapper = 1;
              bVar15 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar15) goto LAB_00401970;
              *(undefined4 *)
               &(local_40->super_DefaultRecyclerCollectionWrapper).super_RecyclerCollectionWrapper.
                _vptr_RecyclerCollectionWrapper = 0;
            }
            bVar15 = Js::Phases::IsEnabled
                               ((Phases *)&DAT_015cd718,BailOutPhase,uVar16,
                                ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.
                                 functionInfo.ptr)->functionId);
            if (((bVar15) &&
                ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_015d346a == '\x01')))) &&
               ((DAT_015d6388 == DAT_015d6390 ||
                (bVar15 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar15)))
               ) {
              iVar17 = (*(pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.
                         super_FinalizableObject.super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject[7])(pFVar20);
              local_40 = (ThreadContext *)CONCAT44(extraout_var_01,iVar17);
              local_58 = Js::FunctionProxy::GetDebugNumberSet
                                   ((FunctionProxy *)pFVar20,(wchar (*) [42])&local_138);
              pcVar22 = Js::OpCodeUtil::GetOpCodeName(local_48->bailOutOpcode);
              pcVar24 = GetBailOutKindName(BailOutIgnoreException);
              Output::Print(L"BailOut: changing due to ignore exception: function: %s (%s) offset: #%04x -> #%04x Opcode: %s Treating as: %S"
                            ,local_40,local_58,(ulong)bailOutOffset,(ulong)local_34,pcVar22,pcVar24)
              ;
              if (bailOutKind != BailOutInvalid) {
                pcVar24 = GetBailOutKindName(bailOutKind);
                Output::Print(L" Kind: %S",pcVar24);
              }
              Output::Print(L"\n");
            }
            uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
            if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
                (FunctionInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar21 = 1;
              bVar15 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar15) goto LAB_00401970;
              *puVar21 = 0;
            }
            bVar15 = Js::Phases::IsEnabled
                               ((Phases *)&DAT_015d3490,BailOutPhase,uVar16,
                                ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.
                                 functionInfo.ptr)->functionId);
            if (((bVar15) &&
                ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_015d346a == '\x01')))) &&
               ((DAT_015d6388 == DAT_015d6390 ||
                (bVar15 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar15)))
               ) {
              iVar17 = (*(pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.
                         super_FinalizableObject.super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject[7])(pFVar20);
              pcVar22 = Js::OpCodeUtil::GetOpCodeName(local_48->bailOutOpcode);
              pcVar24 = GetBailOutKindName(BailOutIgnoreException);
              Output::Print(L"BailOut: changing due to ignore exception: function %s, Opcode: %s, Treating as: %S"
                            ,CONCAT44(extraout_var_02,iVar17),pcVar22,pcVar24);
              if (bailOutKind != BailOutInvalid) {
                pcVar24 = GetBailOutKindName(bailOutKind);
                Output::Print(L" Kind: %S",pcVar24);
              }
              Output::Print(L"\n");
            }
            local_4c = 0;
            bVar15 = true;
          }
          else {
            local_4c = 0;
          }
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar21 = 1;
        bVar15 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                            ,0x5ab,"(isSameFunction)",
                            "Bailout due to ignore exception in different function, can\'t bail out cross functions!"
                           );
        if (!bVar15) goto LAB_00401970;
        *puVar21 = 0;
        bVar15 = true;
        local_4c = (undefined4)CONCAT71(extraout_var,1);
        local_34 = bailOutOffset;
      }
      args = local_60;
      uVar19 = local_34;
      if (bVar15) {
        DebuggingFlags::ResetByteCodeOffsetAndFuncAfterIgnoreException(this);
        uVar19 = local_34;
      }
    }
  }
  local_34 = uVar19;
  uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
  if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar21 = 1;
    bVar15 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                        ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar15) goto LAB_00401970;
    *puVar21 = 0;
  }
  bVar15 = Js::Phases::IsEnabled
                     ((Phases *)&DAT_015cd718,BailOutPhase,uVar16,
                      ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                      ->functionId);
  if (((bVar15) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_015d346a == '\x01'))))
     && ((DAT_015d6388 == DAT_015d6390 ||
         (bVar15 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar15)))) {
    iVar17 = (*(pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar20);
    pcVar22 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)pFVar20,(wchar (*) [42])&local_138);
    pcVar23 = Js::OpCodeUtil::GetOpCodeName(local_48->bailOutOpcode);
    Output::Print(L"BailOut: function: %s (%s) offset: #%04x Opcode: %s",
                  CONCAT44(extraout_var_03,iVar17),pcVar22,(ulong)local_34,pcVar23);
    if (bailOutKind != BailOutInvalid) {
      pcVar24 = GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S",pcVar24);
    }
    Output::Print(L"\n");
  }
  uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
  if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar21 = 1;
    bVar15 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                        ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar15) goto LAB_00401970;
    *puVar21 = 0;
  }
  bVar15 = Js::Phases::IsEnabled
                     ((Phases *)&DAT_015d3490,BailOutPhase,uVar16,
                      ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                      ->functionId);
  if (((bVar15) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_015d346a == '\x01'))))
     && ((DAT_015d6388 == DAT_015d6390 ||
         (bVar15 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind), bVar15)))) {
    iVar17 = (*(pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar20);
    pcVar22 = Js::OpCodeUtil::GetOpCodeName(local_48->bailOutOpcode);
    Output::Print(L"BailOut: function %s, Opcode: %s",CONCAT44(extraout_var_04,iVar17),pcVar22);
    if (bailOutKind != BailOutInvalid) {
      GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S");
    }
    Output::Print(L"\n");
  }
  if ((((char)local_50 != '\0') && (((ulong)args->Info & 0xffffff) != 0)) &&
     (((ulong)args->Info & 0xffffff) != 0)) {
    local_58 = (char16 *)__tls_get_addr(&PTR_0155fe48);
    local_40 = (ThreadContext *)&DAT_015cd718;
    local_88 = (NumberSet *)&DAT_015d6368;
    uVar37 = 0;
    local_90 = pFVar20;
    do {
      pvVar26 = args->Values[uVar37];
      if (DAT_015d346a == '\x01') {
        uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
        if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          pcVar22 = local_58;
          pcVar22[0] = L'\x01';
          pcVar22[1] = L'\0';
          bVar15 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                              ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar15) goto LAB_00401970;
          pcVar22[0] = L'\0';
          pcVar22[1] = L'\0';
          pFVar20 = local_90;
        }
        bVar15 = Js::Phases::IsEnabled
                           ((Phases *)local_40,BailOutPhase,uVar16,
                            ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo
                            .ptr)->functionId);
        if ((bVar15) &&
           ((DAT_015d6388 == DAT_015d6390 ||
            (bVar15 = Js::NumberSet::Contains(local_88,bailOutKind), bVar15)))) {
          Output::Print(L"BailOut:   Argument #%3u: value: 0x%p",uVar37 & 0xffffffff,pvVar26);
        }
      }
      pvVar25 = Js::JavascriptOperators::BoxStackInstance(pvVar26,local_70,true,false);
      args = local_60;
      if ((pvVar25 != pvVar26) && (local_60->Values[uVar37] = pvVar25, DAT_015d346a == '\x01')) {
        uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
        if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          pcVar22 = local_58;
          pcVar22[0] = L'\x01';
          pcVar22[1] = L'\0';
          bVar15 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                              ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar15) goto LAB_00401970;
          pcVar22[0] = L'\0';
          pcVar22[1] = L'\0';
          pFVar20 = local_90;
        }
        bVar15 = Js::Phases::IsEnabled
                           ((Phases *)local_40,BailOutPhase,uVar16,
                            ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo
                            .ptr)->functionId);
        args = local_60;
        if ((bVar15) &&
           ((DAT_015d6388 == DAT_015d6390 ||
            (bVar15 = Js::NumberSet::Contains(local_88,bailOutKind), bVar15)))) {
          Output::Print(L" (Boxed: 0x%p)");
        }
      }
      if (DAT_015d346a == '\x01') {
        uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
        if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          pcVar22 = local_58;
          pcVar22[0] = L'\x01';
          pcVar22[1] = L'\0';
          bVar15 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                              ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar15) goto LAB_00401970;
          pcVar22[0] = L'\0';
          pcVar22[1] = L'\0';
          pFVar20 = local_90;
        }
        bVar15 = Js::Phases::IsEnabled
                           ((Phases *)local_40,BailOutPhase,uVar16,
                            ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo
                            .ptr)->functionId);
        if ((bVar15) &&
           ((DAT_015d6388 == DAT_015d6390 ||
            (bVar15 = Js::NumberSet::Contains(local_88,bailOutKind), bVar15)))) {
          Output::Print(L"\n");
        }
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 < (SUB84(args->Info,0) & 0xffffff));
  }
  if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar21 = 1;
    bVar15 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                        ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar15) goto LAB_00401970;
    *puVar21 = 0;
  }
  if ((FunctionBody *)
      (((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
      functionBodyImpl).ptr != pFVar20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar21 = 1;
    bVar15 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                        ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                        "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar15) goto LAB_00401970;
    *puVar21 = 0;
  }
  if ((((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->attributes &
      (Async|Generator)) == None) {
    Js::InterpreterStackFrame::Setup::Setup
              ((Setup *)&tmpAlloc,local_68,args,true,(bool)(char)local_50,false);
    pSVar12 = local_70;
    uVar38 = (ulong)local_ac;
    uVar37 = uVar38 + local_b0;
    if (uVar37 < 0x8001) {
      ThreadContext::ProbeStack(local_70->threadContext,uVar37 * 8 + 0x4000,local_70,returnAddress);
      allocation = (Var *)((long)&local_138 - (uVar37 * 8 + 0xf & 0xfffffffffffffff0));
      ppvVar31 = allocation;
LAB_00400ee7:
      stackAllocation = (Var *)0x0;
    }
    else {
      stack0xffffffffffffff20 =
           (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)0x0;
      Js::ScriptContext::EnsureInterpreterArena
                (local_70,(ArenaAllocator **)(debugStringBuffer + 0x28));
      allocation = (Var *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                          ::AllocInternal(stack0xffffffffffffff20,(ulong)local_b0 << 3);
      ppvVar31 = &local_138;
      if (uVar38 == 0) goto LAB_00400ee7;
      ThreadContext::ProbeStack(pSVar12->threadContext,uVar38 * 8 + 0x4000,pSVar12,returnAddress);
      ppvVar31 = (Var *)((long)&local_138 - (uVar38 * 8 + 0xf & 0xfffffffffffffff0));
      stackAllocation = ppvVar31;
    }
    ppvVar31[-1] = (Var)0x400efb;
    pvVar27 = Js::FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar20,LoopHeaderArray);
    if (pvVar27 == (void *)0x0) {
      loopHeaderArray = (LoopHeader *)0x0;
    }
    else {
      ppvVar31[-1] = (Var)0x400f08;
      loopHeaderArray = Js::FunctionBody::GetLoopHeaderArrayPtr(pFVar20);
    }
    pJVar11 = local_78;
    ppvVar31[-1] = (Var)0x400f19;
    ppvVar28 = Js::JavascriptCallStackLayout::GetArgv(pJVar11);
    ppvVar31[-2] = (Var)0xfefefefefefefefe;
    ppvVar31[-1] = (Var)0xfefefefefefefefe;
    ppvVar31[-3] = ppvVar31 + -2;
    ppvVar31[-4] = ppvVar28;
    ppvVar31[-5] = (Var)0x400f4b;
    this_00 = (JavascriptGenerator *)
              Js::InterpreterStackFrame::Setup::InitializeAllocation
                        ((Setup *)&tmpAlloc,allocation,stackAllocation,false,false,loopHeaderArray,
                         (DWORD_PTR)ppvVar31[-4],ppvVar31[-3]);
    ppvVar36 = ppvVar31 + -2;
    ppvVar31[-3] = (Var)0x400f5f;
    Js::ByteCodeReader::Create((ByteCodeReader *)this_00,pFVar20,0);
  }
  else {
    if (((ulong)args->Info & 0xffffff) != 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar21 = 1;
      bVar15 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                          ,0x600,"(args.Info.Count == 2)",
                          "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object"
                         );
      if (!bVar15) goto LAB_00401970;
      *puVar21 = 0;
    }
    pvVar26 = Js::Arguments::operator[](args,0);
    tmpAlloc = (ArenaAllocator *)Js::VarTo<Js::JavascriptGenerator>(pvVar26);
    this_00 = (JavascriptGenerator *)(((JavascriptGenerator *)tmpAlloc)->frame).ptr;
    if (this_00 == (JavascriptGenerator *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar21 = 1;
      bVar15 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                          ,0x608,"(newInstance != nullptr)","newInstance != nullptr");
      if (!bVar15) goto LAB_00401970;
      *puVar21 = 0;
    }
    Js::InterpreterStackFrame::ResetOut((InterpreterStackFrame *)this_00);
    *(ArenaAllocator ***)&this_00[1].bailInSymbolsTraceArrayCount = &tmpAlloc;
  }
  pJVar11 = local_78;
  iVar17 = local_48->globalBailOutRecordTable->forInEnumeratorArrayRestoreOffset;
  if (iVar17 != -1) {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x400f77;
    pFVar29 = Js::JavascriptCallStackLayout::GetForInObjectEnumeratorArrayAtOffset(pJVar11,iVar17);
    this_00[1].super_DynamicObject.auxSlots.ptr = (WriteBarrierPtr<void> *)pFVar29;
  }
  this_00[3].args.Info = (Type)local_48->ehBailoutData;
  uVar10 = (ushort)*(undefined4 *)((long)&this_00[2].super_DynamicObject.auxSlots.ptr + 4);
  *(ushort *)((long)&this_00[2].super_DynamicObject.auxSlots.ptr + 4) = uVar10 | 8;
  if (bailOutKind == BailOutOnArrayAccessHelperCall) {
    uVar35 = 0x18;
LAB_00400fb7:
    *(ushort *)((long)&this_00[2].super_DynamicObject.auxSlots.ptr + 4) = uVar35 | uVar10;
  }
  else if (bailOutKind == BailOutOnNotNativeArray) {
    uVar35 = 0x88;
    goto LAB_00400fb7;
  }
  if ((char)local_50 != '\0') {
    pbVar2 = (byte *)((long)&this_00[2].super_DynamicObject.auxSlots.ptr + 4);
    *pbVar2 = *pbVar2 | 0x40;
  }
  pTVar34 = (ThreadContext *)
            this_00[1].super_DynamicObject.field_1.objectArray.ptr[0x1a].super_DynamicObject.
            auxSlots.ptr;
  if ((bailOutKind & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls) {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x400ff2;
    ThreadContext::ClearImplicitCallFlags(pTVar34);
  }
  pSVar7 = local_68;
  local_40 = pTVar34;
  *(undefined8 *)((long)ppvVar36 + -8) = 0x401002;
  pFVar30 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar7);
  *(undefined8 *)((long)ppvVar36 + -8) = 0x40100a;
  RVar18 = Js::FunctionBody::GetVarCount(pFVar30);
  if (RVar18 != 0) {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x401018;
    pFVar30 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar7);
    *(undefined8 *)((long)ppvVar36 + -8) = 0x401025;
    uVar19 = Js::FunctionBody::GetCountField(pFVar30,ConstantCount);
    *(undefined8 *)((long)ppvVar36 + -8) = 0x40103f;
    memset(&this_00[3].scriptFunction + uVar19,0,(ulong)RVar18 << 3);
  }
  *(undefined8 *)((long)ppvVar36 + -8) = 0x401047;
  localRegisterID = Js::FunctionBody::GetLocalFrameDisplayRegister(pFVar20);
  *(undefined8 *)((long)ppvVar36 + -8) = 0x401052;
  localRegisterID_00 = Js::FunctionBody::GetLocalClosureRegister(pFVar20);
  *(undefined8 *)((long)ppvVar36 + -8) = 0x40105d;
  RVar18 = Js::FunctionBody::GetParamClosureRegister(pFVar20);
  pJVar11 = local_78;
  if ((char)local_50 == '\0') {
    local_58 = (char16 *)CONCAT44(local_58._4_4_,RVar18);
    if (localRegisterID != 0xffffffff) {
      TVar4 = (pFVar20->super_ParseableFunctionInfo).m_inParamCount;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401082;
      ppvVar31 = Js::JavascriptCallStackLayout::GetArgv(pJVar11);
      pFVar32 = (FrameDisplay *)ppvVar31[(ulong)(TVar4 == 0) - 7];
      RVar18 = (RegSlot)local_58;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401092;
      Js::InterpreterStackFrame::SetLocalFrameDisplay((InterpreterStackFrame *)this_00,pFVar32);
    }
    pJVar11 = local_78;
    if (localRegisterID_00 != 0xffffffff) {
      TVar4 = (pFVar20->super_ParseableFunctionInfo).m_inParamCount;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4010b3;
      ppvVar31 = Js::JavascriptCallStackLayout::GetArgv(pJVar11);
      pvVar26 = *(Var *)((long)ppvVar31 + ((ulong)(TVar4 == 0) << 3 | 0xffffffffffffffc0));
      RVar18 = (RegSlot)local_58;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4010c2;
      Js::InterpreterStackFrame::SetLocalClosure((InterpreterStackFrame *)this_00,pvVar26);
    }
  }
  pBVar14 = local_48;
  pSVar12 = local_70;
  pJVar11 = local_78;
  *(ulong *)((long)ppvVar36 + -0x18) = (ulong)(byte)local_4c;
  *(void **)((long)ppvVar36 + -0x20) = returnAddress;
  *(Var *)((long)ppvVar36 + -0x28) = branchValue;
  *(Var **)((long)ppvVar36 + -0x30) = pArgumentsObject;
  *(BailOutReturnValue **)((long)ppvVar36 + -0x38) = bailOutReturnValue;
  *(Var **)((long)ppvVar36 + -0x40) = registerSaves;
  *(undefined8 *)((long)ppvVar36 + -0x48) = 0x4010f4;
  RestoreValues(pBVar14,bailOutKind,pJVar11,(InterpreterStackFrame *)this_00,pSVar12,false,
                *(Var **)((long)ppvVar36 + -0x40),*(BailOutReturnValue **)((long)ppvVar36 + -0x38),
                *(Var **)((long)ppvVar36 + -0x30),*(Var *)((long)ppvVar36 + -0x28),
                *(void **)((long)ppvVar36 + -0x20),*(bool *)((long)ppvVar36 + -0x18),
                *(void **)((long)ppvVar36 + -0x10));
  if (localRegisterID != 0xffffffff) {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x401109;
    pFVar32 = (FrameDisplay *)
              Js::InterpreterStackFrame::GetNonVarReg
                        ((InterpreterStackFrame *)this_00,localRegisterID);
    if (pFVar32 != (FrameDisplay *)0x0) {
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401119;
      Js::InterpreterStackFrame::SetLocalFrameDisplay((InterpreterStackFrame *)this_00,pFVar32);
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401126;
      Js::InterpreterStackFrame::SetNonVarReg
                ((InterpreterStackFrame *)this_00,localRegisterID,(Var)0x0);
    }
  }
  if (localRegisterID_00 != 0xffffffff) {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x401137;
    pvVar26 = Js::InterpreterStackFrame::GetNonVarReg
                        ((InterpreterStackFrame *)this_00,localRegisterID_00);
    if (pvVar26 != (Var)0x0) {
      puVar1 = &local_48->globalBailOutRecordTable->field_0x2c;
      *puVar1 = *puVar1 | 0x20;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401152;
      Js::InterpreterStackFrame::SetLocalClosure((InterpreterStackFrame *)this_00,pvVar26);
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40115f;
      Js::InterpreterStackFrame::SetNonVarReg
                ((InterpreterStackFrame *)this_00,localRegisterID_00,(Var)0x0);
    }
  }
  if (RVar18 != 0xffffffff) {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x40116e;
    pvVar26 = Js::InterpreterStackFrame::GetNonVarReg((InterpreterStackFrame *)this_00,RVar18);
    if (pvVar26 != (Var)0x0) {
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40117e;
      Js::InterpreterStackFrame::SetParamClosure((InterpreterStackFrame *)this_00,pvVar26);
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40118a;
      Js::InterpreterStackFrame::SetNonVarReg((InterpreterStackFrame *)this_00,RVar18,(Var)0x0);
    }
  }
  pSVar12 = local_70;
  bVar3 = local_48->globalBailOutRecordTable->field_0x2c;
  if ((bVar3 & 0x10) != 0) {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x4011b7;
    Js::InterpreterStackFrame::TrySetFrameObjectInHeapArgObj
              ((InterpreterStackFrame *)this_00,pSVar12,(bool)((bVar3 & 8) >> 3),
               (bool)((bVar3 & 0x20) >> 5));
  }
  puVar1 = &local_48->globalBailOutRecordTable->field_0x2c;
  *puVar1 = *puVar1 & 0xdf;
  *(undefined8 *)((long)ppvVar36 + -8) = 0x4011cf;
  uVar19 = Js::FunctionBody::GetCountField(pFVar20,InnerScopeCount);
  if (uVar19 != 0) {
    index = 0;
    do {
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4011e0;
      RVar18 = Js::FunctionBody::GetFirstInnerScopeRegister(pFVar20);
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4011ef;
      pvVar26 = Js::InterpreterStackFrame::GetNonVarReg
                          ((InterpreterStackFrame *)this_00,RVar18 + index);
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4011fd;
      Js::InterpreterStackFrame::SetInnerScopeFromIndex
                ((InterpreterStackFrame *)this_00,index,pvVar26);
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40120a;
      Js::InterpreterStackFrame::SetNonVarReg
                ((InterpreterStackFrame *)this_00,RVar18 + index,(Var)0x0);
      index = index + 1;
    } while (uVar19 != index);
  }
  pSVar33 = local_68;
  *(byte *)((long)&this_00[2].super_DynamicObject.auxSlots.ptr + 6) =
       *(byte *)((long)&this_00[2].super_DynamicObject.auxSlots.ptr + 6) & 0xfe |
       ((bailOutKind & BailOutForDebuggerBits) == BailOutInvalid || local_34 != 0);
  pSVar7 = *local_98;
  if (local_68 != pSVar7) {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x401253;
    pSVar33 = (ScriptFunction *)
              Js::StackScriptFunction::GetCurrentFunctionObject((JavascriptFunction *)pSVar33);
    if (pSVar7 != pSVar33) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401266;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401276;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40129e;
      bVar15 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                          ,0x6e6,
                          "(currentFunctionObject == Js::StackScriptFunction::GetCurrentFunctionObject(function))"
                          ,
                          "currentFunctionObject == Js::StackScriptFunction::GetCurrentFunctionObject(function)"
                         );
      if (!bVar15) goto LAB_00401970;
      *puVar21 = 0;
    }
    *(undefined8 *)((long)ppvVar36 + -8) = 0x4012b8;
    Js::InterpreterStackFrame::SetExecutingStackFunction((InterpreterStackFrame *)this_00,pSVar7);
  }
  pBVar14 = local_48;
  pSVar7 = local_68;
  *(undefined8 *)((long)ppvVar36 + -8) = 0x4012c5;
  UpdatePolymorphicFieldAccess((JavascriptFunction *)pSVar7,pBVar14);
  *(undefined8 *)((long)ppvVar36 + -8) = 0x4012cd;
  uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
  if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    *(undefined8 *)((long)ppvVar36 + -8) = 0x4012e4;
    Js::Throw::LogAssert();
    *(undefined8 *)((long)ppvVar36 + -8) = 0x4012f4;
    puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar21 = 1;
    *(undefined8 *)((long)ppvVar36 + -8) = 0x40131c;
    bVar15 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                        ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar15) goto LAB_00401970;
    *puVar21 = 0;
  }
  LVar5 = ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionId;
  *(undefined8 *)((long)ppvVar36 + -8) = 0x40134a;
  bVar15 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,BailOutPhase,uVar16,LVar5);
  if (bVar15) {
LAB_004013db:
    *(undefined8 *)((long)ppvVar36 + -8) = 0x4013e0;
    Output::Flush();
  }
  else {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x40135a;
    uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
    if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401371;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401381;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4013a9;
      bVar15 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                          ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar15) goto LAB_00401970;
      *puVar21 = 0;
    }
    LVar5 = ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
            functionId;
    *(undefined8 *)((long)ppvVar36 + -8) = 0x4013d7;
    bVar15 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,BailOutPhase,uVar16,LVar5);
    if (bVar15) goto LAB_004013db;
  }
  *(undefined8 *)((long)ppvVar36 + -8) = 0x4013e8;
  Js::FunctionBody::BeginExecution(pFVar20);
  uVar19 = local_34;
  *(undefined8 *)((long)ppvVar36 + -8) = 0x4013f3;
  Js::ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this_00,uVar19);
  pTVar34 = (ThreadContext *)
            this_00[1].super_DynamicObject.field_1.objectArray.ptr[0x1a].super_DynamicObject.
            auxSlots.ptr;
  local_c8 = false;
  this_00[1].args.Values = (Type)returnAddress;
  this_00[1].scriptFunction.ptr = (ScriptFunction *)register0x00000020;
  tmpAlloc = (ArenaAllocator *)pTVar34;
  generator = this_00;
  if ((*(byte *)(*(long *)&this_00[1].state + 0x46) & 2) == 0) {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x40143e;
    ThreadContext::PushInterpreterFrame(pTVar34,(InterpreterStackFrame *)this_00);
  }
  else {
    local_c8 = true;
  }
  pTVar34 = local_40;
  if ((char)local_7c == '\0') {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x401468;
    local_40 = (ThreadContext *)Js::InterpreterStackFrame::Process((InterpreterStackFrame *)this_00)
    ;
  }
  else {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x40145a;
    local_40 = (ThreadContext *)
               Js::InterpreterStackFrame::DebugProcess((InterpreterStackFrame *)this_00);
  }
  *(undefined8 *)((long)ppvVar36 + -8) = 0x401478;
  Js::InterpreterStackFrame::PushPopFrameHelper::~PushPopFrameHelper
            ((PushPopFrameHelper *)&tmpAlloc);
  *(undefined8 *)((long)ppvVar36 + -8) = 0x401480;
  Js::FunctionBody::EndExecution(pFVar20);
  if ((pFVar20->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    *(undefined8 *)((long)ppvVar36 + -8) = 0x401492;
    this_01 = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar20);
    flags = pTVar34->implicitCallFlags;
    *(undefined8 *)((long)ppvVar36 + -8) = 0x4014a1;
    Js::DynamicProfileInfo::RecordImplicitCallFlags(this_01,flags);
  }
  if (DAT_015d346a == '\x01') {
    pJVar8 = (JavascriptFunction *)this_00[1].frame.ptr;
    *(undefined8 *)((long)ppvVar36 + -8) = 0x4014c1;
    pFVar30 = Js::JavascriptFunction::GetFunctionBody(pJVar8);
    *(undefined8 *)((long)ppvVar36 + -8) = 0x4014c9;
    uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar30);
    pJVar8 = (JavascriptFunction *)this_00[1].frame.ptr;
    *(undefined8 *)((long)ppvVar36 + -8) = 0x4014d8;
    pFVar30 = Js::JavascriptFunction::GetFunctionBody(pJVar8);
    if ((pFVar30->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4014f0;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401500;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401528;
      bVar15 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                          ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar15) goto LAB_00401970;
      *puVar21 = 0;
    }
    LVar5 = ((pFVar30->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
            functionId;
    *(undefined8 *)((long)ppvVar36 + -8) = 0x40155e;
    bVar15 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,BailOutPhase,uVar16,LVar5);
    if (bVar15) {
      if (DAT_015d6388 != DAT_015d6390) {
        *(undefined8 *)((long)ppvVar36 + -8) = 0x401588;
        bVar15 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind);
        if (!bVar15) goto LAB_0040159e;
      }
      pTVar34 = local_40;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40159e;
      Output::Print(L"BailOut:   Return Value: 0x%p",pTVar34);
    }
  }
LAB_0040159e:
  pAVar13 = local_60;
  pTVar34 = local_40;
  if ((local_48->globalBailOutRecordTable->field_0x2c & 2) != 0) {
    if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4015cd;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4015dd;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401605;
      bVar15 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                          ,0x4ff,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar15) goto LAB_00401970;
      *puVar21 = 0;
    }
    if ((FunctionBody *)
        (((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr != pFVar20) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40162b;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40163b;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401663;
      bVar15 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                          ,0x500,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                          "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar15) goto LAB_00401970;
      *puVar21 = 0;
    }
    pTVar34 = local_40;
    if ((((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->attributes &
        Generator) != None) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40168d;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40169d;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4016c5;
      bVar15 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                          ,0x70c,"(!executeFunction->IsGenerator())",
                          "Generator functions are not expected to be inlined. If this changes then need to use the real user args here from the generator object"
                         );
      if (!bVar15) goto LAB_00401970;
      *puVar21 = 0;
    }
    if (((ulong)pAVar13->Info & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4016ea;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4016fa;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401722;
      bVar15 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                          ,0x70d,"(args.Info.Count != 0)","args.Info.Count != 0");
      if (!bVar15) goto LAB_00401970;
      *puVar21 = 0;
    }
    pSVar7 = local_68;
    pvVar26 = *pAVar13->Values;
    *(undefined8 *)((long)ppvVar36 + -8) = 0x401745;
    instance = (ThreadContext *)
               Js::JavascriptFunction::FinishConstructor
                         (pTVar34,pvVar26,(JavascriptFunction *)pSVar7,false);
    pSVar12 = local_70;
    *(undefined8 *)((long)ppvVar36 + -8) = 0x40175b;
    pTVar34 = (ThreadContext *)
              Js::JavascriptOperators::BoxStackInstance(instance,pSVar12,true,false);
    if ((instance != pTVar34) && (DAT_015d346a == '\x01')) {
      pJVar8 = (JavascriptFunction *)this_00[1].frame.ptr;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401787;
      pFVar20 = Js::JavascriptFunction::GetFunctionBody(pJVar8);
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40178f;
      uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
      pJVar8 = (JavascriptFunction *)this_00[1].frame.ptr;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40179e;
      pFVar20 = Js::JavascriptFunction::GetFunctionBody(pJVar8);
      if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        *(undefined8 *)((long)ppvVar36 + -8) = 0x4017b6;
        Js::Throw::LogAssert();
        *(undefined8 *)((long)ppvVar36 + -8) = 0x4017c6;
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar21 = 1;
        *(undefined8 *)((long)ppvVar36 + -8) = 0x4017ee;
        bVar15 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                            ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar15) goto LAB_00401970;
        *puVar21 = 0;
      }
      LVar5 = ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
              functionId;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x401824;
      bVar15 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,BailOutPhase,uVar16,LVar5);
      if (bVar15) {
        if (DAT_015d6388 != DAT_015d6390) {
          *(undefined8 *)((long)ppvVar36 + -8) = 0x40184e;
          bVar15 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind);
          if (!bVar15) goto LAB_00401872;
        }
        *(undefined8 *)((long)ppvVar36 + -8) = 0x401863;
        Output::Print(L" (Boxed: 0x%p)",pTVar34);
      }
    }
  }
LAB_00401872:
  if (DAT_015d346a == '\x01') {
    pJVar8 = (JavascriptFunction *)this_00[1].frame.ptr;
    *(undefined8 *)((long)ppvVar36 + -8) = 0x40188b;
    pFVar20 = Js::JavascriptFunction::GetFunctionBody(pJVar8);
    *(undefined8 *)((long)ppvVar36 + -8) = 0x401893;
    uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
    pJVar8 = (JavascriptFunction *)this_00[1].frame.ptr;
    *(undefined8 *)((long)ppvVar36 + -8) = 0x4018a2;
    pFVar20 = Js::JavascriptFunction::GetFunctionBody(pJVar8);
    if ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4018bd;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4018cd;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar36 + -8) = 0x4018f5;
      bVar15 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                          ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar15) {
LAB_00401970:
        pcVar9 = (code *)invalidInstructionException();
        (*pcVar9)();
      }
      *puVar21 = 0;
    }
    LVar5 = ((pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
            functionId;
    *(undefined8 *)((long)ppvVar36 + -8) = 0x401926;
    bVar15 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,BailOutPhase,uVar16,LVar5);
    if (bVar15) {
      if (DAT_015d6388 != DAT_015d6390) {
        *(undefined8 *)((long)ppvVar36 + -8) = 0x40194c;
        bVar15 = Js::NumberSet::Contains((NumberSet *)&DAT_015d6368,bailOutKind);
        if (!bVar15) {
          return pTVar34;
        }
      }
      *(undefined8 *)((long)ppvVar36 + -8) = 0x40195e;
      Output::Print(L"\n");
    }
  }
  return pTVar34;
}

Assistant:

Js::Var
BailOutRecord::BailOutHelper(Js::JavascriptCallStackLayout * layout, Js::ScriptFunction ** functionRef, Js::Arguments& args, const bool isInlinee,
    BailOutRecord const * bailOutRecord, uint32 bailOutOffset, void * returnAddress, IR::BailOutKind bailOutKind, Js::Var * registerSaves, BailOutReturnValue * bailOutReturnValue, Js::Var* pArgumentsObject,
    Js::Var branchValue, void * argoutRestoreAddress)
{
    Js::ScriptFunction * function = *functionRef;
    Js::FunctionBody * executeFunction = function->GetFunctionBody();
    Js::ScriptContext * functionScriptContext = executeFunction->GetScriptContext();

    // Whether to enter StartCall while doing RestoreValues. We don't do that when bailout due to ignore exception under debugger.
    bool useStartCall = true;

    // Clear the disable implicit call bit in case we bail from that region
    functionScriptContext->GetThreadContext()->ClearDisableImplicitFlags();

#ifdef ENABLE_SCRIPT_DEBUGGING
    bool isInDebugMode = executeFunction->IsInDebugMode();

    // Adjust bailout offset for debug mode (only scenario when we ignore exception).
    if (isInDebugMode)
    {
        Js::DebugManager* debugManager = functionScriptContext->GetThreadContext()->GetDebugManager();
        DebuggingFlags* debuggingFlags = debugManager->GetDebuggingFlags();
        int byteCodeOffsetAfterEx = debuggingFlags->GetByteCodeOffsetAfterIgnoreException();

        // Note that in case where bailout for ignore exception immediately follows regular bailout after a helper,
        // and ignore exception happens, we would bail out with non-exception kind with exception data recorded.
        // In this case we need to treat the bailout as ignore exception one and continue to next/set stmt.
        // This is fine because we only set byteCodeOffsetAfterEx for helpers (HelperMethodWrapper, when enabled)
        // and ignore exception is needed for all helpers.
        if ((bailOutKind & IR::BailOutIgnoreException) || byteCodeOffsetAfterEx != DebuggingFlags::InvalidByteCodeOffset)
        {
            bool needResetData = true;

            // Note: the func # in debuggingFlags still can be 0 in case actual b/o reason was not BailOutIgnoreException,
            //       but BailOutIgnoreException was on the OR'ed values for b/o check.
            bool isSameFunction = debuggingFlags->GetFuncNumberAfterIgnoreException() == DebuggingFlags::InvalidFuncNumber ||
                debuggingFlags->GetFuncNumberAfterIgnoreException() == function->GetFunctionBody()->GetFunctionNumber();
            AssertMsg(isSameFunction, "Bailout due to ignore exception in different function, can't bail out cross functions!");

            if (isSameFunction)
            {
                Assert(!(byteCodeOffsetAfterEx == DebuggingFlags::InvalidByteCodeOffset && debuggingFlags->GetFuncNumberAfterIgnoreException() != DebuggingFlags::InvalidFuncNumber));

                if (byteCodeOffsetAfterEx != DebuggingFlags::InvalidByteCodeOffset)
                {
                    // We got an exception in native frame, and need to bail out to interpreter
                    if (debugManager->stepController.IsActive())
                    {
                        // Native frame went away, and there will be interpreter frame on its place.
                        // Make sure that frameAddrWhenSet it less than current interpreter frame -- we use it to detect stack depth.
                        debugManager->stepController.SetFrameAddr(0);
                    }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                    if (bailOutOffset != (uint)byteCodeOffsetAfterEx || !(bailOutKind & IR::BailOutIgnoreException))
                    {
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                        BAILOUT_KIND_TRACE(executeFunction, bailOutKind, _u("BailOut: changing due to ignore exception: function: %s (%s) offset: #%04x -> #%04x Opcode: %s Treating as: %S"), executeFunction->GetDisplayName(),
                            executeFunction->GetDebugNumberSet(debugStringBuffer), bailOutOffset, byteCodeOffsetAfterEx, Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode), ::GetBailOutKindName(IR::BailOutIgnoreException));
                        BAILOUT_TESTTRACE(executeFunction, bailOutKind, _u("BailOut: changing due to ignore exception: function %s, Opcode: %s, Treating as: %S"), executeFunction->GetDisplayName(),
                            Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode), ::GetBailOutKindName(IR::BailOutIgnoreException));
                    }
#endif

                    // Set the byte code offset to continue from next user statement.
                    bailOutOffset = byteCodeOffsetAfterEx;

                    // Reset current call count so that we don't do StartCall for inner calls. See WinBlue 272569.
                    // The idea is that next statement can never be set to the inner StartCall (another call as part of an ArgOut),
                    // it will be next statement in the function.
                    useStartCall = false;
                }
                else
                {
                    needResetData = false;
                }
            }

            if (needResetData)
            {
                // Reset/correct the flag as either we processed it or we need to correct wrong flag.
                debuggingFlags->ResetByteCodeOffsetAndFuncAfterIgnoreException();
            }
        }
    }
#endif

#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    BAILOUT_KIND_TRACE(executeFunction, bailOutKind, _u("BailOut: function: %s (%s) offset: #%04x Opcode: %s"), executeFunction->GetDisplayName(),
        executeFunction->GetDebugNumberSet(debugStringBuffer), bailOutOffset, Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));
    BAILOUT_TESTTRACE(executeFunction, bailOutKind, _u("BailOut: function %s, Opcode: %s"), executeFunction->GetDisplayName(), Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));

    if (isInlinee && args.Info.Count != 0)
    {
        // Box arguments. Inlinee arguments may be allocated on the stack.
        for(uint i = 0; i < args.Info.Count; ++i)
        {
            const Js::Var arg = args.Values[i];
            BAILOUT_VERBOSE_TRACE(executeFunction, bailOutKind, _u("BailOut:   Argument #%3u: value: 0x%p"), i, arg);
            const Js::Var boxedArg = Js::JavascriptOperators::BoxStackInstance(arg, functionScriptContext, /* allowStackFunction */ true, /* deepCopy */ false);
            if(boxedArg != arg)
            {
                args.Values[i] = boxedArg;
                BAILOUT_VERBOSE_TRACE(executeFunction, bailOutKind, _u(" (Boxed: 0x%p)"), boxedArg);
            }
            BAILOUT_VERBOSE_TRACE(executeFunction, bailOutKind, _u("\n"));
        }
    }

    bool fReleaseAlloc = false;
    Js::InterpreterStackFrame* newInstance = nullptr;
    Js::Var* allocation = nullptr;

    if (executeFunction->IsCoroutine())
    {
        // If the FunctionBody is a generator then this call is being made by one of the three
        // generator resuming methods: next(), throw(), or return(). They all pass the generator
        // object as the first of two arguments. The real user arguments are obtained from the
        // generator object. The second argument is the resume yield object which is only needed
        // when resuming a generator and not needed when yielding from a generator, as is occurring here.
        AssertMsg(args.Info.Count == 2, "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object");
        Js::JavascriptGenerator* generator = Js::VarTo<Js::JavascriptGenerator>(args[0]);
        newInstance = generator->GetFrame();

        // The jit relies on the interpreter stack frame to store various information such as
        // for-in enumerators. Therefore, we always create an interpreter stack frame for generator
        // as part of the resume jump table, at the beginning of the jit'd function, if it doesn't
        // already exist.
        Assert(newInstance != nullptr);

        // BailOut will recompute OutArg pointers based on BailOutRecord. Reset them back
        // to initial position before that happens so that OP_StartCall calls don't accumulate
        // incorrectly over multiple yield bailouts.
        newInstance->ResetOut();

        // The debugger relies on comparing stack addresses of frames to decide when a step_out is complete so
        // give the InterpreterStackFrame a legit enough stack address to make this comparison work.
        newInstance->m_stackAddress = reinterpret_cast<DWORD_PTR>(&generator);
    }
    else
    {
        Js::InterpreterStackFrame::Setup setup(function, args, true /* bailedOut */, isInlinee);
        size_t varAllocCount = setup.GetAllocationVarCount();
        size_t stackVarAllocCount = setup.GetStackAllocationVarCount();
        size_t varSizeInBytes;
        Js::Var *stackAllocation = nullptr;

        // If the locals area exceeds a certain limit, allocate it from a private arena rather than
        // this frame. The current limit is based on an old assert on the number of locals we would allow here.
        if ((varAllocCount + stackVarAllocCount) > Js::InterpreterStackFrame::LocalsThreshold)
        {
            ArenaAllocator *tmpAlloc = nullptr;
            fReleaseAlloc = functionScriptContext->EnsureInterpreterArena(&tmpAlloc);
            varSizeInBytes = varAllocCount * sizeof(Js::Var);
            allocation = (Js::Var*)tmpAlloc->Alloc(varSizeInBytes);
            if (stackVarAllocCount != 0)
            {
                size_t stackVarSizeInBytes = stackVarAllocCount * sizeof(Js::Var);
                PROBE_STACK_PARTIAL_INITIALIZED_BAILOUT_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + stackVarSizeInBytes, returnAddress);
                stackAllocation = (Js::Var*)_alloca(stackVarSizeInBytes);
            }
        }
        else
        {
            varSizeInBytes = (varAllocCount + stackVarAllocCount) * sizeof(Js::Var);
            PROBE_STACK_PARTIAL_INITIALIZED_BAILOUT_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + varSizeInBytes, returnAddress);
            allocation = (Js::Var*)_alloca(varSizeInBytes);
        }

        Js::LoopHeader* loopHeaderArray = nullptr;

        if (executeFunction->GetHasAllocatedLoopHeaders())
        {
            // Loop header array is recycler allocated, so we push it on the stack
            // When we scan the stack, we'll recognize it as a recycler allocated
            // object, and mark it's contents and keep the individual loop header
            // wrappers alive
            loopHeaderArray = executeFunction->GetLoopHeaderArrayPtr();
        }

        // Set stack address for STEP_OUT/recursion detection for new frame.
        // This frame is originally jitted frame for which we create a new interpreter frame on top of it on stack,
        // set the stack address to some stack location that belong to the original jitted frame.
        DWORD_PTR frameStackAddr = reinterpret_cast<DWORD_PTR>(layout->GetArgv());

        // Initialize the interpreter stack frame (constants) but not the param, the bailout record will restore the value
#if DBG
        Js::Var invalidStackVar = (Js::RecyclableObject*)_alloca(sizeof(Js::RecyclableObject));
        memset(invalidStackVar, 0xFE, sizeof(Js::RecyclableObject));
#endif

        newInstance = setup.InitializeAllocation(allocation, stackAllocation, false, false, loopHeaderArray, frameStackAddr
#if DBG
            , invalidStackVar
#endif
            );

        newInstance->m_reader.Create(executeFunction);
    }

    int forInEnumeratorArrayRestoreOffset = bailOutRecord->globalBailOutRecordTable->forInEnumeratorArrayRestoreOffset;
    if (forInEnumeratorArrayRestoreOffset != -1)
    {
        newInstance->forInObjectEnumerators = layout->GetForInObjectEnumeratorArrayAtOffset(forInEnumeratorArrayRestoreOffset);
    }

    newInstance->ehBailoutData = bailOutRecord->ehBailoutData;
    newInstance->OrFlags(Js::InterpreterStackFrameFlags_FromBailOut);
    if (bailOutKind == IR::BailOutOnArrayAccessHelperCall)
    {
        newInstance->OrFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall);
    }
    else if (bailOutKind == IR::BailOutOnNotNativeArray)
    {
        newInstance->OrFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization);
    }

    if (isInlinee)
    {
        newInstance->OrFlags(Js::InterpreterStackFrameFlags_FromBailOutInInlinee);
    }

    ThreadContext *threadContext = newInstance->GetScriptContext()->GetThreadContext();

    // If this is a bailout on implicit calls, then it must have occurred at the current statement.
    // Otherwise, assume that the bits are stale, so clear them before entering the interpreter.
    if (!BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind))
    {
        threadContext->ClearImplicitCallFlags();
    }

    Js::RegSlot varCount = function->GetFunctionBody()->GetVarCount();
    if (varCount)
    {
        Js::RegSlot constantCount = function->GetFunctionBody()->GetConstantCount();
        memset(newInstance->m_localSlots + constantCount, 0, varCount * sizeof(Js::Var));
    }

    Js::RegSlot localFrameDisplayReg = executeFunction->GetLocalFrameDisplayRegister();
    Js::RegSlot localClosureReg = executeFunction->GetLocalClosureRegister();
    Js::RegSlot paramClosureReg = executeFunction->GetParamClosureRegister();

    if (!isInlinee)
    {
        // If byte code was generated to do stack closures, restore closure pointers before the normal RestoreValues.
        // If code was jitted for stack closures, we have to restore the pointers from known stack locations.
        // (RestoreValues won't do it.) If stack closures were disabled for this function before we jitted,
        // then the values on the stack are garbage, but if we need them then RestoreValues will overwrite with
        // the correct values.
        if (localFrameDisplayReg != Js::Constants::NoRegister)
        {
            Js::FrameDisplay *localFrameDisplay;
            uintptr_t frameDisplayIndex = (uintptr_t)(
#if _M_IX86 || _M_AMD64
                executeFunction->GetInParamsCount() == 0 ?
                Js::JavascriptFunctionArgIndex_StackFrameDisplayNoArg :
#endif
                Js::JavascriptFunctionArgIndex_StackFrameDisplay) - 2;

            localFrameDisplay = (Js::FrameDisplay*)layout->GetArgv()[frameDisplayIndex];
            newInstance->SetLocalFrameDisplay(localFrameDisplay);
        }

        if (localClosureReg != Js::Constants::NoRegister)
        {
            Js::Var localClosure;
            uintptr_t scopeSlotsIndex = (uintptr_t)(
#if _M_IX86 || _M_AMD64
                executeFunction->GetInParamsCount() == 0 ?
                Js::JavascriptFunctionArgIndex_StackScopeSlotsNoArg :
#endif
                Js::JavascriptFunctionArgIndex_StackScopeSlots) - 2;

            localClosure = layout->GetArgv()[scopeSlotsIndex];
            newInstance->SetLocalClosure(localClosure);
        }
    }

    // Restore bailout values
    bailOutRecord->RestoreValues(bailOutKind, layout, newInstance, functionScriptContext, false, registerSaves, bailOutReturnValue, pArgumentsObject, branchValue, returnAddress, useStartCall, argoutRestoreAddress);

    // For functions that don't get the scope slot and frame display pointers back from the known stack locations
    // (see above), get them back from the designated registers.
    // In either case, clear the values from those registers, because the interpreter should not be able to access
    // those values through the registers (only through its private fields).

    if (localFrameDisplayReg != Js::Constants::NoRegister)
    {
        Js::FrameDisplay *frameDisplay = (Js::FrameDisplay*)newInstance->GetNonVarReg(localFrameDisplayReg);
        if (frameDisplay)
        {
            newInstance->SetLocalFrameDisplay(frameDisplay);
            newInstance->SetNonVarReg(localFrameDisplayReg, nullptr);
        }
    }

    if (localClosureReg != Js::Constants::NoRegister)
    {
        Js::Var closure = newInstance->GetNonVarReg(localClosureReg);
        if (closure)
        {
            bailOutRecord->globalBailOutRecordTable->isScopeObjRestored = true;
            newInstance->SetLocalClosure(closure);
            newInstance->SetNonVarReg(localClosureReg, nullptr);
        }
    }

    if (paramClosureReg != Js::Constants::NoRegister)
    {
        Js::Var closure = newInstance->GetNonVarReg(paramClosureReg);
        if (closure)
        {
            newInstance->SetParamClosure(closure);
            newInstance->SetNonVarReg(paramClosureReg, nullptr);
        }
    }

    if (bailOutRecord->globalBailOutRecordTable->hasStackArgOpt)
    {
        newInstance->TrySetFrameObjectInHeapArgObj(functionScriptContext, bailOutRecord->globalBailOutRecordTable->hasNonSimpleParams,
            bailOutRecord->globalBailOutRecordTable->isScopeObjRestored);
    }

    //Reset the value for tracking the restoration during next bail out.
    bailOutRecord->globalBailOutRecordTable->isScopeObjRestored = false;

    uint32 innerScopeCount = executeFunction->GetInnerScopeCount();
    for (uint32 i = 0; i < innerScopeCount; i++)
    {
        Js::RegSlot reg = executeFunction->GetFirstInnerScopeRegister() + i;
        newInstance->SetInnerScopeFromIndex(i, newInstance->GetNonVarReg(reg));
        newInstance->SetNonVarReg(reg, nullptr);
    }

    newInstance->SetClosureInitDone(bailOutOffset != 0 || !(bailOutKind & IR::BailOutForDebuggerBits));

    // RestoreValues may call EnsureArguments and cause functions to be boxed.
    // Since the interpreter frame that hasn't started yet, StackScriptFunction::Box would not have replaced the function object
    // in the restoring interpreter frame. Let's make sure the current interpreter frame has the unboxed version.
    // Note: Only use the unboxed version if we have replaced the function argument on the stack via boxing
    // so that the interpreter frame we are bailing out to matches the one in the function argument list
    // (which is used by the stack walker to match up stack frame and the interpreter frame).
    // Some function are boxed but we continue to use the stack version to call the function - those that only live in register
    // and are not captured in frame displays.
    // Those uses are fine, but that means the function argument list will have the stack function object that is passed it and
    // not be replaced with a just boxed one.

    Js::ScriptFunction * currentFunctionObject = *functionRef;
    if (function != currentFunctionObject)
    {
        Assert(currentFunctionObject == Js::StackScriptFunction::GetCurrentFunctionObject(function));
        newInstance->SetExecutingStackFunction(currentFunctionObject);
    }

    UpdatePolymorphicFieldAccess(function, bailOutRecord);

    BAILOUT_FLUSH(executeFunction);

    executeFunction->BeginExecution();

    // Restart at the bailout byte code offset.
    newInstance->m_reader.SetCurrentOffset(bailOutOffset);

    Js::Var aReturn = nullptr;

    {
        // Following _AddressOfReturnAddress <= real address of "returnAddress". Suffices for RemoteStackWalker to test partially initialized interpreter frame.
        Js::InterpreterStackFrame::PushPopFrameHelper pushPopFrameHelper(newInstance, returnAddress, _AddressOfReturnAddress());
#ifdef ENABLE_SCRIPT_DEBUGGING
        aReturn = isInDebugMode ? newInstance->DebugProcess() : newInstance->Process();
#else
        aReturn = newInstance->Process();
#endif
        // Note: in debug mode we always have to bailout to debug thunk,
        //       as normal interpreter thunk expects byte code compiled w/o debugging.
    }

    executeFunction->EndExecution();

    if (executeFunction->HasDynamicProfileInfo())
    {
        Js::DynamicProfileInfo *dynamicProfileInfo = executeFunction->GetAnyDynamicProfileInfo();
        dynamicProfileInfo->RecordImplicitCallFlags(threadContext->GetImplicitCallFlags());
    }

    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("BailOut:   Return Value: 0x%p"), aReturn);
    if (bailOutRecord->globalBailOutRecordTable->isInlinedConstructor)
    {
        AssertMsg(!executeFunction->IsGenerator(), "Generator functions are not expected to be inlined. If this changes then need to use the real user args here from the generator object");
        Assert(args.Info.Count != 0);
        aReturn = Js::JavascriptFunction::FinishConstructor(aReturn, args.Values[0], function);

        Js::Var oldValue = aReturn;
        aReturn = Js::JavascriptOperators::BoxStackInstance(oldValue, functionScriptContext, /* allowStackFunction */ true, /* deepCopy */ false);
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (oldValue != aReturn)
        {
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(" (Boxed: 0x%p)"), aReturn);
        }
#endif
    }
    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("\n"));
    return aReturn;
}